

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *node)

{
  ImVector<ImGuiWindow_*> *this;
  int iVar1;
  ImGuiDockNode *pIVar2;
  ImGuiWindow *window;
  bool bVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImGuiWindow **ppIVar7;
  uint uVar8;
  int i;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  
  pIVar5 = GImGui;
  pIVar2 = node->ParentNode;
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    if ((pIVar2->ChildNodes[0] != node) && (pIVar2->ChildNodes[1] != node)) {
      __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x3954,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
    }
    node->SharedFlags = pIVar2->SharedFlags;
  }
  node->field_0xc5 = node->field_0xc5 & 0xbf;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);
  }
  node->LocalFlagsInWindows = 0;
  this = &node->Windows;
  i = 0;
  while (iVar1 = this->Size, i < iVar1) {
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](this,i);
    window = *ppIVar7;
    if (window->DockNode != node) {
      __assert_fail("window->DockNode == node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x396a,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
    }
    if (node->LastFrameActive + 1 == pIVar5->FrameCount) {
      bVar3 = window->LastFrameActive < node->LastFrameActive;
      if (((*(short *)&node->field_0xc4 < 0) ||
          (bVar4 = false, node->WantCloseTabId == window->TabId)) &&
         (bVar4 = false, window->HasCloseButton == true)) {
        bVar4 = (window->Flags & 0x100000) == 0;
      }
    }
    else {
      bVar3 = false;
      bVar4 = false;
    }
    if ((bVar3 || bVar4) || ((byte)window->field_0x3f9 >> 3 & 1) != 0) {
      window->field_0x3f9 = window->field_0x3f9 & 0xf7;
      if ((this->Size == 1) && ((node->MergedFlags & 0x800) == 0)) {
        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        DockNodeRemoveWindow(node,window,node->ID);
        return;
      }
      DockNodeRemoveWindow(node,window,node->ID);
    }
    else {
      node->LocalFlagsInWindows =
           node->LocalFlagsInWindows | (window->WindowClass).DockNodeFlagsOverrideSet;
      i = i + 1;
    }
  }
  uVar8 = node->LocalFlags;
  uVar6 = node->LocalFlagsInWindows | node->SharedFlags;
  uVar11 = uVar6 | uVar8;
  node->MergedFlags = uVar11;
  bVar10 = node->field_0xc6;
  bVar12 = bVar10;
  if (((bVar10 & 4) != 0) && (bVar12 = bVar10 | 8, (uVar11 & 0x2040) != 0x40 || iVar1 != 1)) {
    bVar12 = bVar10;
  }
  bVar9 = bVar12 & 0xfb;
  node->field_0xc6 = bVar9;
  bVar10 = bVar9;
  if ((((bVar12 & 8) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (bVar10 = bVar12 & 0xf3,
     ((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000) == 0)) {
    bVar10 = bVar9;
  }
  if (iVar1 < 2) {
    if ((bVar10 & 8) == 0) goto LAB_00164258;
    uVar8 = uVar8 ^ 0x2000;
  }
  else {
    uVar8 = uVar8 & 0xffffdfff;
  }
  node->LocalFlags = uVar8;
  node->MergedFlags = uVar6 | uVar8;
LAB_00164258:
  node->field_0xc6 = bVar10 & 0xf3;
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);

    // Remove inactive windows, collapse nodes
    // Merge node flags overrides stored in windows
    node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->TabId) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
            continue;
        }

        // FIXME-DOCKING: Missing policies for conflict resolution, hence the "Experimental" tag on this.
        //node->LocalFlagsInWindow &= ~window->WindowClass.DockNodeFlagsOverrideClear;
        node->LocalFlagsInWindows |= window->WindowClass.DockNodeFlagsOverrideSet;
    }
    node->UpdateMergedFlags();

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->MergedFlags;
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);
    else if (node->WantHiddenTabBarToggle)
        node->SetLocalFlags(node->LocalFlags ^ ImGuiDockNodeFlags_HiddenTabBar);
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}